

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *offsets,uchar *head)

{
  uchar *data_ptr;
  int compression_type;
  int line_order;
  int x_stride;
  int height;
  int iVar1;
  int iVar2;
  pointer puVar3;
  pointer puVar4;
  EXRChannelInfo *pEVar5;
  EXRAttribute *attributes;
  int *piVar6;
  int width;
  int num_lines;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int extraout_EAX;
  EXRTile *pEVar10;
  uchar **ppuVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  unsigned_long uVar15;
  size_type sVar16;
  int data_height;
  ulong pixel_data_size;
  size_t y_idx;
  int *piVar17;
  ulong uVar18;
  int data_width;
  size_type __new_size;
  uint uVar19;
  long lVar20;
  undefined4 in_stack_ffffffffffffff48;
  int num_channels;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  
  num_channels = exr_header->num_channels;
  iVar9 = exr_header->compression_type;
  __new_size = (size_type)num_channels;
  pvVar21 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10;
  if ((iVar9 != 3) && (iVar9 != 0x80)) {
    if (iVar9 == 4) {
      pvVar21 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x20;
    }
    else {
      pvVar21 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    }
  }
  iVar9 = exr_header->data_window[2] - exr_header->data_window[0];
  iVar12 = exr_header->data_window[3] - exr_header->data_window[1];
  puVar3 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar4 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar5 = exr_header->channels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&channel_offset_list,__new_size);
  pixel_data_size = 0;
  if (num_channels != 0) {
    piVar17 = &pEVar5->pixel_type;
    uVar15 = 0;
    sVar16 = 0;
    do {
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar16] = uVar15;
      uVar18 = (ulong)(uint)*piVar17;
      if (uVar18 < 3) {
        pixel_data_size = (ulong)(uint)((int)pixel_data_size + *(int *)(&DAT_00156570 + uVar18 * 4))
        ;
        uVar15 = uVar15 + *(long *)(&DAT_00156580 + uVar18 * 8);
      }
      sVar16 = sVar16 + 1;
      piVar17 = piVar17 + 0x44;
    } while (__new_size != sVar16);
    pixel_data_size = (ulong)(int)pixel_data_size;
  }
  data_width = iVar9 + 1;
  data_height = iVar12 + 1;
  if (exr_header->tiled == 0) {
    ppuVar11 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                             data_width,data_height);
    exr_image->images = ppuVar11;
    uVar19 = (uint)((ulong)((long)puVar3 - (long)puVar4) >> 3);
    if (0 < (int)uVar19) {
      uVar18 = 0;
      do {
        piVar17 = (int *)(head + (offsets->
                                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar18]);
        iVar9 = *piVar17;
        iVar14 = (int)pvVar21 + iVar9;
        iVar12 = exr_header->data_window[3] + 1;
        if (iVar14 <= iVar12) {
          iVar12 = iVar14;
        }
        DecodePixelData(exr_image->images,exr_header->requested_pixel_types,(uchar *)(piVar17 + 2),
                        (long)piVar17[1],exr_header->compression_type,exr_header->line_order,
                        data_width,data_height,data_width,(int)uVar18,
                        iVar9 - exr_header->data_window[1],iVar12 - iVar9,pixel_data_size,
                        (long)exr_header->num_channels,(EXRAttribute *)exr_header->channels,
                        (size_t)&channel_offset_list,
                        (EXRChannelInfo *)CONCAT44(num_channels,in_stack_ffffffffffffff48),pvVar21);
        uVar18 = uVar18 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar18);
    }
  }
  else {
    puVar3 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pEVar10 = (EXRTile *)malloc(((long)puVar3 - (long)puVar4) * 4);
    exr_image->tiles = pEVar10;
    lVar20 = (long)puVar3 - (long)puVar4;
    if (lVar20 != 0) {
      lVar20 = lVar20 >> 3;
      pvVar21 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (lVar20 + (ulong)(lVar20 == 0));
      lVar13 = 0;
      do {
        ppuVar11 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types
                                 ,data_width,data_height);
        pEVar10 = exr_image->tiles;
        *(uchar ***)((long)&pEVar10->images + lVar13 * 4) = ppuVar11;
        data_ptr = head + *(long *)((long)(offsets->
                                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar13) +
                          0x14;
        uVar7 = *(undefined8 *)(data_ptr + -0x14);
        uVar8 = *(undefined8 *)(data_ptr + -0xc);
        iVar14 = *(int *)(data_ptr + -4);
        piVar17 = exr_header->requested_pixel_types;
        compression_type = exr_header->compression_type;
        line_order = exr_header->line_order;
        x_stride = exr_header->tile_size_x;
        height = exr_header->tile_size_y;
        iVar1 = *(int *)(data_ptr + -0x10);
        width = data_width - *(int *)(data_ptr + -0x14) * x_stride;
        if ((*(int *)(data_ptr + -0x14) + 1) * x_stride <= iVar9) {
          width = x_stride;
        }
        iVar2 = exr_header->num_channels;
        attributes = (EXRAttribute *)exr_header->channels;
        (&pEVar10->width)[lVar13] = width;
        num_lines = data_height - iVar1 * height;
        if ((iVar1 + 1) * height <= iVar12) {
          num_lines = height;
        }
        (&pEVar10->height)[lVar13] = num_lines;
        DecodePixelData(ppuVar11,piVar17,data_ptr,(long)iVar14,compression_type,line_order,width,
                        height,x_stride,0,0,num_lines,pixel_data_size,(long)iVar2,attributes,
                        (size_t)&channel_offset_list,
                        (EXRChannelInfo *)CONCAT44(num_channels,in_stack_ffffffffffffff48),pvVar21);
        piVar17 = &exr_image->tiles->offset_x + lVar13;
        *(undefined8 *)piVar17 = uVar7;
        *(undefined8 *)(piVar17 + 2) = uVar8;
        exr_image->num_tiles = (int)lVar20;
        lVar13 = lVar13 + 8;
        pvVar21 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&pvVar21[-1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
      } while (pvVar21 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0);
    }
  }
  if (0 < exr_header->num_channels) {
    piVar17 = exr_header->pixel_types;
    piVar6 = exr_header->requested_pixel_types;
    lVar20 = 0;
    do {
      piVar17[lVar20] = piVar6[lVar20];
      lVar20 = lVar20 + 1;
    } while (lVar20 < exr_header->num_channels);
  }
  exr_image->num_channels = num_channels;
  exr_image->width = data_width;
  exr_image->height = data_height;
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(channel_offset_list.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)channel_offset_list.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)channel_offset_list.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    data_height = extraout_EAX;
  }
  return data_height;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<unsigned long long> &offsets,
                       const unsigned char *head) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                &channel_offset, num_channels,
                                exr_header->channels);

  if (exr_header->tiled) {
    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        malloc(sizeof(EXRTile) * static_cast<size_t>(num_tiles)));

    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
      // Allocate memory for each tile.
      exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
          num_channels, exr_header->channels, exr_header->requested_pixel_types,
          data_width, data_height);

      // 16 byte: tile coordinates
      // 4 byte : data size
      // ~      : data(uncompressed or compressed)
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

      int tile_coordinates[4];
      memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

      // @todo{ LoD }
      assert(tile_coordinates[2] == 0);
      assert(tile_coordinates[3] == 0);

      int data_len;
      memcpy(&data_len, data_ptr + 16,
             sizeof(int));  // 16 = sizeof(tile_coordinates)
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));
      assert(data_len >= 4);

      // Move to data addr: 20 = 16 + 4;
      data_ptr += 20;

      tinyexr::DecodeTiledPixelData(
          exr_image->tiles[tile_idx].images,
          &(exr_image->tiles[tile_idx].width),
          &(exr_image->tiles[tile_idx].height),
          exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, tile_coordinates[0],
          tile_coordinates[1], exr_header->tile_size_x, exr_header->tile_size_y,
          static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);

      exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
      exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
      exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
      exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

      exr_image->num_tiles = static_cast<int>(num_tiles);
    }
  } else {  // scanline format

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#ifdef _OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {
      size_t y_idx = static_cast<size_t>(y);
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);
      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(uncompressed or compressed)
      int line_no;
      memcpy(&line_no, data_ptr, sizeof(int));
      int data_len;
      memcpy(&data_len, data_ptr + 4, sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

      int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                   (exr_header->data_window[3] + 1));

      int num_lines = end_line_no - line_no;
      assert(num_lines > 0);

      // printf("num_blocks = %lu, y = %d, lineno = %d, end_line_no = %d,
      // num_lines = %d, data_len = %d\n", num_blocks, y, line_no, end_line_no,
      // num_lines, data_len);

      // Move to data addr: 8 = 4 + 4;
      data_ptr += 8;

      // Adjust line_no with data_window.bmin.y
      line_no -= exr_header->data_window[1];

      tinyexr::DecodePixelData(
          exr_image->images, exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, data_width, y,
          line_no, num_lines, static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);
    }  // omp parallel
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}